

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::encode(JsonCodec *this,Reader input,Type type,Builder output)

{
  byte bVar1;
  Arena *pAVar2;
  double dVar3;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Field field_04;
  Field field_05;
  Field field_06;
  Field field_07;
  Reader input_00;
  Reader input_01;
  Reader input_02;
  Reader input_03;
  Builder output_00;
  Builder output_01;
  Builder output_02;
  Builder output_03;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  StructSchema SVar7;
  undefined4 uVar8;
  WirePointer *pWVar9;
  undefined8 uVar10;
  uint uVar11;
  ReaderFor<bool> RVar12;
  bool bVar13;
  Which WVar14;
  undefined2 *puVar15;
  int64_t iVar16;
  uint64_t uVar17;
  undefined7 extraout_var;
  ElementCount EVar18;
  Reader *reader;
  char *pcVar19;
  uint size;
  Iterator __begin3;
  size_t sVar20;
  Iterator __end3;
  ulong uVar21;
  ReaderFor<Text> RVar22;
  ReaderFor<DynamicEnum> RVar23;
  ArrayPtr<const_char> value;
  Reader RVar24;
  ListSchema LVar25;
  Reader RVar26;
  Type type_00;
  Reader value_00;
  Reader value_01;
  size_t sStackY_5b0;
  undefined4 uVar27;
  ListElementCount LVar28;
  undefined4 uVar29;
  StructDataBitCount SVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined8 in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  undefined8 in_stack_fffffffffffffaa8;
  undefined8 in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffac0;
  size_t pos;
  uint local_530;
  uint fieldCount;
  Field field;
  bool *local_4e0;
  Builder array;
  undefined4 local_4b0;
  undefined4 uStack_498;
  Builder array_1;
  undefined7 local_468;
  undefined1 uStack_461;
  undefined7 uStack_460;
  undefined1 uStack_459;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined7 uStack_450;
  undefined1 uStack_449;
  Fault f;
  Array<bool> hasField_heap;
  Type type_local;
  Builder outField;
  ReaderFor<capnp::DynamicStruct> structValue;
  Builder local_2c8;
  Builder local_2a0;
  Builder local_278;
  Builder object;
  StructBuilder local_228;
  Field local_200;
  Reader local_1c0;
  Reader local_178;
  Reader local_130;
  bool hasField_stack [32];
  Reader local_c0;
  Reader local_78;
  
  type_local._0_8_ = type.field_4;
  reader = type._0_8_;
  kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::Type&>
            ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)&array,
             (Type *)&((this->impl).ptr)->typeHandlers);
  if (array.builder.segment != (SegmentBuilder *)0x0) {
    pAVar2 = ((array.builder.segment)->super_SegmentReader).arena;
    DynamicValue::Reader::Reader(&local_130,reader);
    (**pAVar2->_vptr_Arena)(pAVar2,this,&local_130);
    DynamicValue::Reader::~Reader(&local_130);
    return;
  }
  WVar14 = LIST;
  if (type_local.listDepth == '\0') {
    WVar14 = type_local.baseType;
  }
  switch(WVar14) {
  case VOID:
    *(undefined2 *)
     CONCAT44(input.field_1.textValue.super_StringPtr.content.size_._4_4_,
              input.field_1.textValue.super_StringPtr.content.size_._0_4_) = 0;
    break;
  case BOOL:
    RVar12 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(reader);
    puVar15 = (undefined2 *)
              CONCAT44(input.field_1.textValue.super_StringPtr.content.size_._4_4_,
                       input.field_1.textValue.super_StringPtr.content.size_._0_4_);
    *puVar15 = 1;
    *(byte *)(puVar15 + 1) = *(byte *)(puVar15 + 1) & 0xfe | RVar12;
    break;
  case INT8:
  case INT16:
  case INT32:
  case UINT8:
  case UINT16:
  case UINT32:
    dVar3 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(reader);
    goto LAB_00285844;
  case INT64:
    iVar16 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(reader);
    array_1.builder.segment._0_1_ = (char)iVar16;
    array_1.builder.segment._1_6_ = (undefined6)((ulong)iVar16 >> 8);
    array_1.builder.segment._7_1_ = (undefined1)((ulong)iVar16 >> 0x38);
    kj::str<long>((String *)&array,(long *)&array_1);
    if (array.builder.capTable == (CapTableBuilder *)0x0) {
      array.builder.segment = (SegmentBuilder *)0x4706a1;
    }
    value_00.super_StringPtr.content.size_ =
         (long)&((array.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
         (ulong)(array.builder.capTable == (CapTableBuilder *)0x0);
    value_00.super_StringPtr.content.ptr = (char *)array.builder.segment;
    capnp::json::Value::Builder::setString((Builder *)&input,value_00);
    goto LAB_00285c42;
  case UINT64:
    uVar17 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(reader);
    array_1.builder.segment._0_1_ = (char)uVar17;
    array_1.builder.segment._1_6_ = (undefined6)(uVar17 >> 8);
    array_1.builder.segment._7_1_ = (undefined1)(uVar17 >> 0x38);
    kj::str<unsigned_long>((String *)&array,(unsigned_long *)&array_1);
    if (array.builder.capTable == (CapTableBuilder *)0x0) {
      array.builder.segment = (SegmentBuilder *)0x4706a1;
    }
    value_01.super_StringPtr.content.size_ =
         (long)&((array.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
         (ulong)(array.builder.capTable == (CapTableBuilder *)0x0);
    value_01.super_StringPtr.content.ptr = (char *)array.builder.segment;
    capnp::json::Value::Builder::setString((Builder *)&input,value_01);
    goto LAB_00285c42;
  case FLOAT32:
  case FLOAT64:
    dVar3 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(reader);
    if (INFINITY <= dVar3) {
      value.size_ = 9;
      value.ptr = "Infinity";
      goto LAB_00285bcf;
    }
    if (dVar3 <= -INFINITY) {
      pcVar19 = "-Infinity";
      sStackY_5b0 = 10;
LAB_00285bce:
      value.size_ = sStackY_5b0;
      value.ptr = pcVar19;
LAB_00285bcf:
      capnp::json::Value::Builder::setString((Builder *)&input,(Reader)value);
      return;
    }
    if (NAN(dVar3)) {
      pcVar19 = "NaN";
      sStackY_5b0 = 4;
      goto LAB_00285bce;
    }
    puVar15 = (undefined2 *)
              CONCAT44(input.field_1.textValue.super_StringPtr.content.size_._4_4_,
                       input.field_1.textValue.super_StringPtr.content.size_._0_4_);
    goto LAB_00285850;
  case TEXT:
    RVar22 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(reader);
    array_1.builder.segment._0_1_ = (char)RVar22.super_StringPtr.content.ptr;
    array_1.builder.segment._1_6_ = RVar22.super_StringPtr.content.ptr._1_6_;
    array_1.builder.segment._7_1_ = RVar22.super_StringPtr.content.ptr._7_1_;
    array_1.builder.capTable._0_7_ = (undefined7)RVar22.super_StringPtr.content.size_;
    array_1.builder.capTable._7_1_ = RVar22.super_StringPtr.content.size_._7_1_;
    kj::str<capnp::Text::Reader>
              ((String *)&array,(kj *)&array_1,RVar22.super_StringPtr.content.size_);
    if (array.builder.capTable == (CapTableBuilder *)0x0) {
      array.builder.segment = (SegmentBuilder *)0x4706a1;
    }
    RVar26.super_StringPtr.content.size_ =
         (long)&((array.builder.capTable)->super_CapTableReader)._vptr_CapTableReader +
         (ulong)(array.builder.capTable == (CapTableBuilder *)0x0);
    RVar26.super_StringPtr.content.ptr = (char *)array.builder.segment;
    capnp::json::Value::Builder::setString((Builder *)&input,RVar26);
LAB_00285c42:
    kj::Array<char>::~Array((Array<char> *)&array);
    break;
  case DATA:
    RVar24 = DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(reader);
    capnp::json::Value::Builder::initArray
              ((Builder *)&array.builder,(Builder *)&input,
               (uint)RVar24.super_ArrayPtr<const_unsigned_char>.size_);
    for (sVar20 = 0; RVar24.super_ArrayPtr<const_unsigned_char>.size_ != sVar20; sVar20 = sVar20 + 1
        ) {
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)&array_1,&array.builder,(ElementCount)sVar20);
      bVar1 = RVar24.super_ArrayPtr<const_unsigned_char>.ptr[sVar20];
      *(undefined2 *)CONCAT44(array_1.builder.ptr._4_4_,(uint)array_1.builder.ptr) = 2;
      *(double *)((undefined2 *)CONCAT44(array_1.builder.ptr._4_4_,(uint)array_1.builder.ptr) + 4) =
           (double)bVar1;
    }
    break;
  case LIST:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&array,reader);
    LVar25 = Type::asList(&type_local);
    capnp::json::Value::Builder::initArray(&array_1,(Builder *)&input,local_4b0);
    for (uVar21 = 0; (uint)local_4b0 != uVar21; uVar21 = uVar21 + 1) {
      DynamicList::Reader::operator[](&local_78,(Reader *)&array,(uint)uVar21);
      capnp::_::ListBuilder::getStructElement(&local_228,&array_1.builder,(uint)uVar21);
      input_00.field_1.intValue._0_4_ = (int)local_228.capTable;
      input_00._0_8_ = local_228.segment;
      input_00.field_1.intValue._4_4_ = (int)((ulong)local_228.capTable >> 0x20);
      input_00.field_1.textValue.super_StringPtr.content.size_._0_4_ = (int)local_228.data;
      input_00.field_1.textValue.super_StringPtr.content.size_._4_4_ =
           (int)((ulong)local_228.data >> 0x20);
      input_00.field_1._16_4_ = (int)local_228.pointers;
      input_00.field_1._20_4_ = (int)((ulong)local_228.pointers >> 0x20);
      input_00.field_1.listValue.reader.capTable = (CapTableReader *)local_228._32_8_;
      input_00.field_1.listValue.reader.ptr = (byte *)in_stack_fffffffffffffa80;
      input_00.field_1._40_8_ = in_stack_fffffffffffffa88;
      input_00.field_1._48_8_ = in_stack_fffffffffffffa90;
      input_00.field_1._56_8_ = in_stack_fffffffffffffa98;
      output_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffaa8;
      output_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffaa0;
      output_00._builder.data = (void *)in_stack_fffffffffffffab0;
      output_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffab8;
      output_00._builder.dataSize = (int)in_stack_fffffffffffffac0;
      output_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffac0 >> 0x20);
      output_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffac0 >> 0x30);
      type_00.field_4.scopeId = LVar25.elementType._0_8_;
      type_00._0_8_ = &local_78;
      encode(this,input_00,type_00,output_00);
      DynamicValue::Reader::~Reader(&local_78);
    }
    break;
  case ENUM:
    RVar23 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(reader);
    field.parent.super_Schema.raw = (Schema)RVar23.schema.super_Schema.raw;
    field.index._0_2_ = RVar23.value;
    DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&array,(DynamicEnum *)&field);
    if ((char)array.builder.segment == '\x01') {
      array_1.builder._39_1_ = SUB41(local_4b0,0);
      array_1.builder.ptr._7_1_ = (undefined1)array.builder.elementCount;
      array_1.builder._24_7_ = array.builder._25_7_;
      array_1.builder.step._3_1_ = (undefined1)array.builder.structDataSize;
      array_1.builder._32_7_ = array.builder._33_7_;
      array_1.builder.segment._7_1_ = SUB81(array.builder.capTable,0);
      array_1.builder.capTable._0_7_ = (undefined7)((ulong)array.builder.capTable >> 8);
      array_1.builder.capTable._7_1_ = SUB81(array.builder.ptr,0);
      array_1.builder.ptr._0_4_ = (uint)((ulong)array.builder.ptr >> 8);
      array_1.builder.ptr._4_3_ = (undefined3)((ulong)array.builder.ptr >> 0x28);
      array.builder.segment = (SegmentBuilder *)array.builder._24_8_;
      array.builder.capTable = (CapTableBuilder *)array.builder._32_8_;
      value = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName((Reader *)&array);
      goto LAB_00285bcf;
    }
    dVar3 = (double)(uint16_t)field.index;
LAB_00285844:
    puVar15 = (undefined2 *)
              CONCAT44(input.field_1.textValue.super_StringPtr.content.size_._4_4_,
                       input.field_1.textValue.super_StringPtr.content.size_._0_4_);
LAB_00285850:
    *puVar15 = 2;
    *(double *)(puVar15 + 4) = dVar3;
    break;
  case STRUCT:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&structValue,reader);
    array_1.builder.segment._0_1_ = (char)structValue.schema.super_Schema.raw;
    array_1.builder.segment._1_6_ = structValue.schema.super_Schema.raw._1_6_;
    array_1.builder.segment._7_1_ = structValue.schema.super_Schema.raw._7_1_;
    StructSchema::getNonUnionFields((FieldSubset *)&array,(StructSchema *)&array_1);
    hasField_heap.size_ = (size_t)(uint)uStack_498;
    if (hasField_heap.size_ < 0x21) {
      hasField_heap.ptr = (bool *)0x0;
      hasField_heap.size_ = 0;
      hasField_heap.disposer = (ArrayDisposer *)0x0;
      local_4e0 = hasField_stack;
    }
    else {
      local_4e0 = kj::_::HeapArrayDisposer::allocate<bool>(hasField_heap.size_);
      hasField_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      hasField_heap.ptr = local_4e0;
    }
    fieldCount = 0;
    for (uVar21 = 0; size = fieldCount, (uint)uStack_498 != uVar21; uVar21 = uVar21 + 1) {
      StructSchema::FieldSubset::operator[](&local_200,(FieldSubset *)&array,(uint)uVar21);
      field_00.index = local_200.index;
      field_00.parent.super_Schema.raw = local_200.parent.super_Schema.raw;
      field_00._12_4_ = local_200._12_4_;
      field_00.proto._reader.segment._0_4_ = (int)local_200.proto._reader.segment;
      field_00.proto._reader.segment._4_4_ = (int)((ulong)local_200.proto._reader.segment >> 0x20);
      field_00.proto._reader.capTable._0_4_ = (int)local_200.proto._reader.capTable;
      field_00.proto._reader.capTable._4_4_ = (int)((ulong)local_200.proto._reader.capTable >> 0x20)
      ;
      field_00.proto._reader.data = local_200.proto._reader.data;
      field_00.proto._reader.pointers = local_200.proto._reader.pointers;
      field_00.proto._reader.dataSize = local_200.proto._reader.dataSize;
      field_00.proto._reader.pointerCount = local_200.proto._reader.pointerCount;
      field_00.proto._reader._38_2_ = local_200.proto._reader._38_2_;
      field_00.proto._reader.nestingLimit = local_200.proto._reader.nestingLimit;
      field_00.proto._reader._44_4_ = local_200.proto._reader._44_4_;
      bVar13 = DynamicStruct::Reader::has(&structValue,field_00,((this->impl).ptr)->hasMode);
      local_4e0[uVar21] = bVar13;
      fieldCount = size + bVar13;
    }
    DynamicStruct::Reader::which((Maybe<capnp::StructSchema::Field> *)&array_1,&structValue);
    if ((char)array_1.builder.segment == '\x01') {
      field_01.proto._reader.data._7_1_ = uStack_461;
      field_01.proto._reader.data._0_7_ = local_468;
      field_01.proto._reader.pointers._7_1_ = uStack_459;
      field_01.proto._reader.pointers._0_7_ = uStack_460;
      field_01.proto._reader._36_4_ = uStack_454;
      field_01.proto._reader.dataSize = local_458;
      field_01.proto._reader._47_1_ = uStack_449;
      field_01.proto._reader._40_7_ = uStack_450;
      field_01.parent.super_Schema.raw._4_4_ =
           (int)(CONCAT17(array_1.builder.capTable._7_1_,array_1.builder.capTable._0_7_) >> 0x20);
      field_01.parent.super_Schema.raw._0_4_ = (int)array_1.builder.capTable._0_7_;
      field_01.index = (uint)array_1.builder.ptr;
      field_01._12_4_ = array_1.builder.ptr._4_4_;
      field_01.proto._reader.segment._0_4_ = array_1.builder.elementCount;
      field_01.proto._reader.segment._4_4_ =
           (int)(CONCAT17(array_1.builder.step._3_1_,array_1.builder._24_7_) >> 0x20);
      field_01.proto._reader.capTable._0_4_ = array_1.builder.structDataSize;
      field_01.proto._reader.capTable._4_4_ =
           (int)(CONCAT17(array_1.builder._39_1_,array_1.builder._32_7_) >> 0x20);
      bVar13 = DynamicStruct::Reader::has(&structValue,field_01,((this->impl).ptr)->hasMode);
      local_530 = (uint)CONCAT71(extraout_var,bVar13) ^ 1;
      if (((uint)local_458 < 0x20) ||
         ((~bVar13 & *(short *)(CONCAT17(uStack_461,local_468) + 2) == -1) == 0)) {
        size = size + 1;
        fieldCount = size;
      }
      else if ((char)array_1.builder.segment == '\x01') {
        array_1.builder.segment._0_1_ = '\0';
      }
    }
    else {
      local_530 = 0;
    }
    capnp::json::Value::Builder::initObject(&object,(Builder *)&input,size);
    pos = 0;
    for (uVar21 = 0; (uint)uStack_498 != uVar21; uVar21 = uVar21 + 1) {
      StructSchema::FieldSubset::operator[](&field,(FieldSubset *)&array,(uint)uVar21);
      if (((char)array_1.builder.segment == '\x01') &&
         ((uint)array_1.builder.ptr < CONCAT22(field.index._2_2_,(uint16_t)field.index))) {
        EVar18 = (ElementCount)pos;
        pos = pos + 1;
        capnp::_::ListBuilder::getStructElement(&outField._builder,&object.builder,EVar18);
        f.exception = (Exception *)CONCAT17(array_1.builder.step._3_1_,array_1.builder._24_7_);
        RVar26 = capnp::schema::Field::Reader::getName((Reader *)&f);
        capnp::json::Value::Field::Builder::setName((Builder *)&outField._builder,RVar26);
        uVar8 = array_1.builder.ptr._4_4_;
        uVar11 = (uint)array_1.builder.ptr;
        if ((char)local_530 == '\0') {
          uVar4 = CONCAT17(array_1.builder.capTable._7_1_,array_1.builder.capTable._0_7_);
          uVar5 = CONCAT17(array_1.builder.step._3_1_,array_1.builder._24_7_);
          uVar6 = CONCAT17(array_1.builder._39_1_,array_1.builder._32_7_);
          field_03.proto._reader.data._7_1_ = uStack_461;
          field_03.proto._reader.data._0_7_ = local_468;
          field_03.proto._reader.pointers._7_1_ = uStack_459;
          field_03.proto._reader.pointers._0_7_ = uStack_460;
          field_03.proto._reader._36_4_ = uStack_454;
          field_03.proto._reader.dataSize = local_458;
          field_03.proto._reader._47_1_ = uStack_449;
          field_03.proto._reader._40_7_ = uStack_450;
          field_02.proto._reader.data._7_1_ = uStack_461;
          field_02.proto._reader.data._0_7_ = local_468;
          field_02.proto._reader.pointers._7_1_ = uStack_459;
          field_02.proto._reader.pointers._0_7_ = uStack_460;
          field_02.proto._reader._36_4_ = uStack_454;
          field_02.proto._reader.dataSize = local_458;
          field_02.proto._reader._47_1_ = uStack_449;
          field_02.proto._reader._40_7_ = uStack_450;
          LVar28 = array_1.builder.elementCount;
          SVar30 = array_1.builder.structDataSize;
          uVar27 = (undefined4)array_1.builder.capTable._0_7_;
          field_02.parent.super_Schema.raw._4_4_ =
               (int)(CONCAT17(array_1.builder.capTable._7_1_,array_1.builder.capTable._0_7_) >> 0x20
                    );
          field_02.parent.super_Schema.raw._0_4_ = uVar27;
          field_02.index = (uint)array_1.builder.ptr;
          field_02._12_4_ = array_1.builder.ptr._4_4_;
          field_02.proto._reader.segment._0_4_ = LVar28;
          field_02.proto._reader.segment._4_4_ =
               (int)(CONCAT17(array_1.builder.step._3_1_,array_1.builder._24_7_) >> 0x20);
          field_02.proto._reader.capTable._0_4_ = SVar30;
          field_02.proto._reader.capTable._4_4_ =
               (int)(CONCAT17(array_1.builder._39_1_,array_1.builder._32_7_) >> 0x20);
          DynamicStruct::Reader::get(&local_178,&structValue,field_02);
          capnp::json::Value::Field::Builder::initValue(&local_278,(Builder *)&outField._builder);
          field_03.parent.super_Schema.raw._4_4_ = (int)((ulong)uVar4 >> 0x20);
          field_03.parent.super_Schema.raw._0_4_ = uVar27;
          field_03.index = uVar11;
          field_03._12_4_ = uVar8;
          field_03.proto._reader.segment._0_4_ = LVar28;
          field_03.proto._reader.segment._4_4_ = (int)((ulong)uVar5 >> 0x20);
          field_03.proto._reader.capTable._0_4_ = SVar30;
          field_03.proto._reader.capTable._4_4_ = (int)((ulong)uVar6 >> 0x20);
          input_01.field_1.intValue = (int64_t)local_278._builder.capTable;
          input_01._0_8_ = local_278._builder.segment;
          input_01.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_278._builder.data
          ;
          input_01.field_1.listValue.reader.segment = (SegmentReader *)local_278._builder.pointers;
          input_01.field_1.listValue.reader.capTable = (CapTableReader *)local_278._builder._32_8_;
          input_01.field_1.listValue.reader.ptr = (byte *)in_stack_fffffffffffffac0;
          input_01.field_1._40_8_ = pos;
          input_01.field_1.listValue.reader.structDataSize = local_530;
          input_01.field_1._52_4_ = fieldCount;
          input_01.field_1._56_8_ = field.parent.super_Schema.raw;
          output_01._builder.segment._2_2_ = field.index._2_2_;
          output_01._builder.segment._0_2_ = (uint16_t)field.index;
          output_01._builder.segment._4_4_ = field._12_4_;
          output_01._builder.capTable = (CapTableBuilder *)field.proto._reader.segment;
          output_01._builder.data = field.proto._reader.capTable;
          output_01._builder.pointers._0_1_ = field.proto._reader.data._0_1_;
          output_01._builder.pointers._1_7_ = field.proto._reader.data._1_7_;
          output_01._builder._32_8_ = field.proto._reader.pointers;
          encodeField(this,field_03,input_01,output_01);
          DynamicValue::Reader::~Reader(&local_178);
        }
        else {
          capnp::json::Value::Field::Builder::initValue((Builder *)&f,(Builder *)&outField._builder)
          ;
          *(undefined2 *)CONCAT17(uStack_461,local_468) = 0;
        }
        if ((char)array_1.builder.segment == '\x01') {
          array_1.builder.segment._0_1_ = '\0';
        }
      }
      if (local_4e0[uVar21] == true) {
        EVar18 = (ElementCount)pos;
        pos = pos + 1;
        capnp::_::ListBuilder::getStructElement(&outField._builder,&object.builder,EVar18);
        f.exception = (Exception *)field.proto._reader.segment;
        RVar26 = capnp::schema::Field::Reader::getName((Reader *)&f);
        capnp::json::Value::Field::Builder::setName((Builder *)&outField._builder,RVar26);
        uVar6 = field.proto._reader._40_8_;
        uVar4 = field.proto._reader._32_8_;
        pWVar9 = field.proto._reader.pointers;
        uVar8 = field._12_4_;
        SVar7 = field.parent;
        field_05.index._2_2_ = field.index._2_2_;
        field_05.index._0_2_ = (uint16_t)field.index;
        field_05.proto._reader.data._1_7_ = field.proto._reader.data._1_7_;
        field_05.proto._reader.data._0_1_ = field.proto._reader.data._0_1_;
        field_04.index._2_2_ = field.index._2_2_;
        field_04.index._0_2_ = (uint16_t)field.index;
        field_04.proto._reader.data._1_7_ = field.proto._reader.data._1_7_;
        field_04.proto._reader.data._0_1_ = field.proto._reader.data._0_1_;
        uVar27 = SUB84(field.proto._reader.segment,0);
        uVar29 = (undefined4)((ulong)field.proto._reader.segment >> 0x20);
        uVar31 = SUB84(field.proto._reader.capTable,0);
        uVar32 = (undefined4)((ulong)field.proto._reader.capTable >> 0x20);
        field_04.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
        field_04._12_4_ = field._12_4_;
        field_04.proto._reader.segment._0_4_ = uVar27;
        field_04.proto._reader.segment._4_4_ = uVar29;
        field_04.proto._reader.capTable._0_4_ = uVar31;
        field_04.proto._reader.capTable._4_4_ = uVar32;
        field_04.proto._reader.pointers = field.proto._reader.pointers;
        field_04.proto._reader.dataSize = field.proto._reader.dataSize;
        field_04.proto._reader.pointerCount = field.proto._reader.pointerCount;
        field_04.proto._reader._38_2_ = field.proto._reader._38_2_;
        field_04.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
        field_04.proto._reader._44_4_ = field.proto._reader._44_4_;
        DynamicStruct::Reader::get(&local_c0,&structValue,field_04);
        capnp::json::Value::Field::Builder::initValue(&local_2a0,(Builder *)&outField._builder);
        uVar10 = field.proto._reader._40_8_;
        uVar5 = field.proto._reader._32_8_;
        field_05.parent = (StructSchema)(StructSchema)SVar7.super_Schema.raw;
        field_05._12_4_ = uVar8;
        field_05.proto._reader.segment._0_4_ = uVar27;
        field_05.proto._reader.segment._4_4_ = uVar29;
        field_05.proto._reader.capTable._0_4_ = uVar31;
        field_05.proto._reader.capTable._4_4_ = uVar32;
        field_05.proto._reader.pointers = pWVar9;
        field.proto._reader.dataSize = (StructDataBitCount)uVar4;
        field.proto._reader.pointerCount = SUB82(uVar4,4);
        field.proto._reader._38_2_ = SUB82(uVar4,6);
        field_05.proto._reader.dataSize = field.proto._reader.dataSize;
        field_05.proto._reader.pointerCount = field.proto._reader.pointerCount;
        field_05.proto._reader._38_2_ = field.proto._reader._38_2_;
        field.proto._reader.nestingLimit = (int)uVar6;
        field.proto._reader._44_4_ = SUB84(uVar6,4);
        field_05.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
        field_05.proto._reader._44_4_ = field.proto._reader._44_4_;
        input_02.field_1.intValue = (int64_t)local_2a0._builder.capTable;
        input_02._0_8_ = local_2a0._builder.segment;
        input_02.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_2a0._builder.data;
        input_02.field_1.listValue.reader.segment = (SegmentReader *)local_2a0._builder.pointers;
        input_02.field_1.listValue.reader.capTable = (CapTableReader *)local_2a0._builder._32_8_;
        input_02.field_1.listValue.reader.ptr = (byte *)in_stack_fffffffffffffac0;
        input_02.field_1._40_8_ = pos;
        input_02.field_1.listValue.reader.structDataSize = local_530;
        input_02.field_1._52_4_ = fieldCount;
        input_02.field_1._56_8_ = field.parent.super_Schema.raw;
        output_02._builder.segment._2_2_ = field.index._2_2_;
        output_02._builder.segment._0_2_ = (uint16_t)field.index;
        output_02._builder.segment._4_4_ = field._12_4_;
        output_02._builder.capTable = (CapTableBuilder *)field.proto._reader.segment;
        output_02._builder.data = field.proto._reader.capTable;
        output_02._builder.pointers._0_1_ = field.proto._reader.data._0_1_;
        output_02._builder.pointers._1_7_ = field.proto._reader.data._1_7_;
        output_02._builder._32_8_ = field.proto._reader.pointers;
        field.proto._reader._32_8_ = uVar5;
        field.proto._reader._40_8_ = uVar10;
        encodeField(this,field_05,input_02,output_02);
        DynamicValue::Reader::~Reader(&local_c0);
      }
    }
    if ((char)array_1.builder.segment == '\x01') {
      field.parent.super_Schema.raw._7_1_ = array_1.builder.capTable._7_1_;
      field.parent.super_Schema.raw._0_7_ = array_1.builder.capTable._0_7_;
      field.proto._reader.segment =
           (SegmentReader *)CONCAT17(array_1.builder.step._3_1_,array_1.builder._24_7_);
      field.proto._reader.capTable =
           (CapTableReader *)CONCAT17(array_1.builder._39_1_,array_1.builder._32_7_);
      field.proto._reader.pointers = (WirePointer *)CONCAT17(uStack_459,uStack_460);
      field.proto._reader._36_4_ = uStack_454;
      field.proto._reader.dataSize = local_458;
      field.proto._reader._47_1_ = uStack_449;
      field.proto._reader._40_7_ = uStack_450;
      field.proto._reader.data._0_1_ = (undefined1)local_468;
      field.proto._reader.data._1_7_ = (undefined7)(CONCAT17(uStack_461,local_468) >> 8);
      field.index._0_2_ = (uint16_t)(uint)array_1.builder.ptr;
      field.index._2_2_ = (undefined2)((uint)array_1.builder.ptr >> 0x10);
      field._12_4_ = array_1.builder.ptr._4_4_;
      EVar18 = (ElementCount)pos;
      pos = pos + 1;
      capnp::_::ListBuilder::getStructElement(&outField._builder,&object.builder,EVar18);
      puVar15 = (undefined2 *)
                CONCAT71(field.proto._reader.data._1_7_,field.proto._reader.data._0_1_);
      f.exception = (Exception *)field.proto._reader.segment;
      RVar26 = capnp::schema::Field::Reader::getName((Reader *)&f);
      capnp::json::Value::Field::Builder::setName(&outField,RVar26);
      pWVar9 = field.proto._reader.pointers;
      uVar8 = field._12_4_;
      SVar7 = field.parent;
      if ((char)local_530 == '\0') {
        field_07.index._2_2_ = field.index._2_2_;
        field_07.index._0_2_ = (uint16_t)field.index;
        field_07.proto._reader.data._1_7_ = field.proto._reader.data._1_7_;
        field_07.proto._reader.data._0_1_ = field.proto._reader.data._0_1_;
        field_06.index._2_2_ = field.index._2_2_;
        field_06.index._0_2_ = (uint16_t)field.index;
        field_06.proto._reader.data._1_7_ = field.proto._reader.data._1_7_;
        field_06.proto._reader.data._0_1_ = field.proto._reader.data._0_1_;
        uVar27 = SUB84(field.proto._reader.segment,0);
        uVar29 = (undefined4)((ulong)field.proto._reader.segment >> 0x20);
        uVar31 = SUB84(field.proto._reader.capTable,0);
        uVar32 = (undefined4)((ulong)field.proto._reader.capTable >> 0x20);
        field_06.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
        field_06._12_4_ = field._12_4_;
        field_06.proto._reader.segment._0_4_ = uVar27;
        field_06.proto._reader.segment._4_4_ = uVar29;
        field_06.proto._reader.capTable._0_4_ = uVar31;
        field_06.proto._reader.capTable._4_4_ = uVar32;
        field_06.proto._reader.pointers = field.proto._reader.pointers;
        field_06.proto._reader.dataSize = field.proto._reader.dataSize;
        field_06.proto._reader.pointerCount = field.proto._reader.pointerCount;
        field_06.proto._reader._38_2_ = field.proto._reader._38_2_;
        field_06.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
        field_06.proto._reader._44_4_ = field.proto._reader._44_4_;
        DynamicStruct::Reader::get(&local_1c0,&structValue,field_06);
        capnp::json::Value::Field::Builder::initValue(&local_2c8,&outField);
        field_07.parent = (StructSchema)(StructSchema)SVar7.super_Schema.raw;
        field_07._12_4_ = uVar8;
        field_07.proto._reader.segment._0_4_ = uVar27;
        field_07.proto._reader.segment._4_4_ = uVar29;
        field_07.proto._reader.capTable._0_4_ = uVar31;
        field_07.proto._reader.capTable._4_4_ = uVar32;
        field_07.proto._reader.pointers = pWVar9;
        field_07.proto._reader.dataSize = field.proto._reader.dataSize;
        field_07.proto._reader.pointerCount = field.proto._reader.pointerCount;
        field_07.proto._reader._38_2_ = field.proto._reader._38_2_;
        field_07.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
        field_07.proto._reader._44_4_ = field.proto._reader._44_4_;
        input_03.field_1.intValue = (int64_t)local_2c8._builder.capTable;
        input_03._0_8_ = local_2c8._builder.segment;
        input_03.field_1.textValue.super_StringPtr.content.size_ = (size_t)local_2c8._builder.data;
        input_03.field_1.listValue.reader.segment = (SegmentReader *)local_2c8._builder.pointers;
        input_03.field_1.listValue.reader.capTable = (CapTableReader *)local_2c8._builder._32_8_;
        input_03.field_1.listValue.reader.ptr = (byte *)in_stack_fffffffffffffac0;
        input_03.field_1._40_8_ = pos;
        input_03.field_1.listValue.reader.structDataSize = local_530;
        input_03.field_1._52_4_ = fieldCount;
        input_03.field_1._56_8_ = field.parent.super_Schema.raw;
        output_03._builder.segment._2_2_ = field.index._2_2_;
        output_03._builder.segment._0_2_ = (uint16_t)field.index;
        output_03._builder.segment._4_4_ = field._12_4_;
        output_03._builder.capTable = (CapTableBuilder *)field.proto._reader.segment;
        output_03._builder.data = field.proto._reader.capTable;
        output_03._builder.pointers._0_1_ = field.proto._reader.data._0_1_;
        output_03._builder.pointers._1_7_ = field.proto._reader.data._1_7_;
        output_03._builder._32_8_ = field.proto._reader.pointers;
        encodeField(this,field_07,input_03,output_03);
        DynamicValue::Reader::~Reader(&local_1c0);
      }
      else {
        capnp::json::Value::Field::Builder::initValue((Builder *)&f,&outField);
        *puVar15 = 0;
      }
    }
    field.parent.super_Schema.raw = (Schema)&pos;
    field.index._0_2_ = (uint16_t)&fieldCount;
    field.index._2_2_ = (undefined2)((ulong)&fieldCount >> 0x10);
    field._12_4_ = SUB84((ulong)&fieldCount >> 0x20,0);
    field.proto._reader.segment = (SegmentReader *)anon_var_dwarf_3d166;
    field.proto._reader.capTable = (CapTableReader *)&DAT_00000005;
    field.proto._reader.data._0_1_ = pos == fieldCount;
    if (!(bool)field.proto._reader.data._0_1_) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_int&>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x16a,FAILED,"pos == fieldCount","_kjCondition,",
                 (DebugComparison<unsigned_long_&,_unsigned_int_&> *)&field);
      kj::_::Debug::Fault::fatal(&f);
    }
    kj::Array<bool>::~Array(&hasField_heap);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[90]>
              ((Fault *)&array,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x16f,FAILED,(char *)0x0,
               "\"don\'t know how to JSON-encode capabilities; \" \"please register a JsonCodec::Handler for this\""
               ,(char (*) [90])
                "don\'t know how to JSON-encode capabilities; please register a JsonCodec::Handler for this"
              );
    kj::_::Debug::Fault::fatal((Fault *)&array);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[88]>
              ((Fault *)&array,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x172,FAILED,(char *)0x0,
               "\"don\'t know how to JSON-encode AnyPointer; \" \"please register a JsonCodec::Handler for this\""
               ,(char (*) [88])
                "don\'t know how to JSON-encode AnyPointer; please register a JsonCodec::Handler for this"
              );
    kj::_::Debug::Fault::fatal((Fault *)&array);
  }
  return;
}

Assistant:

void JsonCodec::encode(DynamicValue::Reader input, Type type, JsonValue::Builder output) const {
  // TODO(someday): For interfaces, check for handlers on superclasses, per documentation...
  // TODO(someday): For branded types, should we check for handlers on the generic?
  // TODO(someday): Allow registering handlers for "all structs", "all lists", etc?
  KJ_IF_SOME(handler, impl->typeHandlers.find(type)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  switch (type.which()) {
    case schema::Type::VOID:
      output.setNull();
      break;
    case schema::Type::BOOL:
      output.setBoolean(input.as<bool>());
      break;
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
      output.setNumber(input.as<double>());
      break;
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
      {
        double value = input.as<double>();
        // Inf, -inf and NaN are not allowed in the JSON spec. Storing into string.
        if (kj::inf() == value) {
          output.setString("Infinity");
        } else if (-kj::inf() == value) {
          output.setString("-Infinity");
        } else if (kj::isNaN(value)) {
          output.setString("NaN");
        } else {
          output.setNumber(value);
        }
      }
      break;
    case schema::Type::INT64:
      output.setString(kj::str(input.as<int64_t>()));
      break;
    case schema::Type::UINT64:
      output.setString(kj::str(input.as<uint64_t>()));
      break;
    case schema::Type::TEXT:
      output.setString(kj::str(input.as<Text>()));
      break;
    case schema::Type::DATA: {
      // Turn into array of byte values. Yep, this is pretty ugly. People really need to override
      // this with a handler.
      auto bytes = input.as<Data>();
      auto array = output.initArray(bytes.size());
      for (auto i: kj::indices(bytes)) {
        array[i].setNumber(bytes[i]);
      }
      break;
    }
    case schema::Type::LIST: {
      auto list = input.as<DynamicList>();
      auto elementType = type.asList().getElementType();
      auto array = output.initArray(list.size());
      for (auto i: kj::indices(list)) {
        encode(list[i], elementType, array[i]);
      }
      break;
    }
    case schema::Type::ENUM: {
      auto e = input.as<DynamicEnum>();
      KJ_IF_SOME(symbol, e.getEnumerant()) {
        output.setString(symbol.getProto().getName());
      } else {
        output.setNumber(e.getRaw());
      }
      break;
    }
    case schema::Type::STRUCT: {
      auto structValue = input.as<capnp::DynamicStruct>();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      KJ_STACK_ARRAY(bool, hasField, nonUnionFields.size(), 32, 128);

      uint fieldCount = 0;
      for (auto i: kj::indices(nonUnionFields)) {
        fieldCount += (hasField[i] = structValue.has(nonUnionFields[i], impl->hasMode));
      }

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();
      bool unionFieldIsNull = false;

      KJ_IF_SOME(field, which) {
        // Even if the union field is null, if it is not the default field of the union then we
        // have to print it anyway.
        unionFieldIsNull = !structValue.has(field, impl->hasMode);
        if (field.getProto().getDiscriminantValue() != 0 || !unionFieldIsNull) {
          ++fieldCount;
        } else {
          which = kj::none;
        }
      }

      auto object = output.initObject(fieldCount);

      size_t pos = 0;
      for (auto i: kj::indices(nonUnionFields)) {
        auto field = nonUnionFields[i];
        KJ_IF_SOME(unionField, which) {
          if (unionField.getIndex() < field.getIndex()) {
            auto outField = object[pos++];
            outField.setName(unionField.getProto().getName());
            if (unionFieldIsNull) {
              outField.initValue().setNull();
            } else {
              encodeField(unionField, structValue.get(unionField), outField.initValue());
            }
            which = kj::none;
          }
        }
        if (hasField[i]) {
          auto outField = object[pos++];
          outField.setName(field.getProto().getName());
          encodeField(field, structValue.get(field), outField.initValue());
        }
      }
      if (which != kj::none) {
        // Union field not printed yet; must be last.
        auto unionField = KJ_ASSERT_NONNULL(which);
        auto outField = object[pos++];
        outField.setName(unionField.getProto().getName());
        if (unionFieldIsNull) {
          outField.initValue().setNull();
        } else {
          encodeField(unionField, structValue.get(unionField), outField.initValue());
        }
      }
      KJ_ASSERT(pos == fieldCount);
      break;
    }
    case schema::Type::INTERFACE:
      KJ_FAIL_REQUIRE("don't know how to JSON-encode capabilities; "
                      "please register a JsonCodec::Handler for this");
    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("don't know how to JSON-encode AnyPointer; "
                      "please register a JsonCodec::Handler for this");
  }